

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

bool __thiscall
ctemplate::TemplateDictionary::IsHiddenTemplate(TemplateDictionary *this,TemplateString *name)

{
  small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *this_00;
  int iVar1;
  bool bVar2;
  TemplateId local_30;
  TemplateDictionary *local_28;
  TemplateDictionary *d;
  TemplateString *name_local;
  TemplateDictionary *this_local;
  
  local_28 = this;
  d = (TemplateDictionary *)name;
  name_local = (TemplateString *)this;
  while( true ) {
    if (local_28 == (TemplateDictionary *)0x0) {
      return true;
    }
    bVar2 = false;
    if (local_28->include_dict_ != (IncludeDict *)0x0) {
      this_00 = local_28->include_dict_;
      local_30 = TemplateString::GetGlobalId((TemplateString *)d);
      iVar1 = small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
              ::count(this_00,&local_30);
      bVar2 = iVar1 != 0;
    }
    if (bVar2) break;
    local_28 = local_28->parent_dict_;
  }
  return false;
}

Assistant:

bool TemplateDictionary::IsHiddenTemplate(const TemplateString& name) const {
  for (const TemplateDictionary* d = this; d; d = d->parent_dict_) {
    if (d->include_dict_ &&
        d->include_dict_->count(name.GetGlobalId()))
      return false;
  }
  return true;
}